

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolidShapes.cpp
# Opt level: O3

void __thiscall iDynTree::ExternalMesh::~ExternalMesh(ExternalMesh *this)

{
  ~ExternalMesh(this);
  operator_delete(this,0x170);
  return;
}

Assistant:

ExternalMesh::~ExternalMesh()
    {
    }